

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.cpp
# Opt level: O3

void __thiscall
chrono::ChQuadratureTables::glege_roots
          (ChQuadratureTables *this,ChMatrixDynamic<> *lcoef,int N,int ntable)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (0 < N) {
    uVar2 = 1;
    do {
      dVar5 = cos((((double)(int)uVar2 + -0.25) * 3.141592653589793) / ((double)N + 0.5));
      uVar1 = 0;
      do {
        dVar6 = glege_eval(N,dVar5,lcoef);
        dVar7 = glege_diff(N,dVar5,lcoef);
        dVar6 = dVar5 - dVar6 / dVar7;
        auVar4._8_8_ = 0x7fffffffffffffff;
        auVar4._0_8_ = 0x7fffffffffffffff;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar6 - dVar5;
        auVar4 = vandpd_avx512vl(auVar8,auVar4);
        if (auVar4._0_8_ <= 1e-12) break;
        bVar3 = uVar1 < 0x18;
        uVar1 = uVar1 + 1;
        dVar5 = dVar6;
      } while (bVar3);
      *(double *)
       (*(long *)&(this->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[ntable].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + -8 + uVar2 * 8) = dVar6;
      dVar5 = glege_diff(N,dVar6,lcoef);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar6;
      auVar4 = vfnmadd213sd_fma(auVar9,auVar9,ZEXT816(0x3ff0000000000000));
      *(double *)
       (*(long *)&(this->Weight).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[ntable].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl + -8 + uVar2 * 8) =
           2.0 / (dVar5 * auVar4._0_8_ * dVar5);
      uVar2 = uVar2 + 1;
    } while (uVar2 != N + 1);
  }
  return;
}

Assistant:

void ChQuadratureTables::glege_roots(ChMatrixDynamic<>& lcoef, int N, int ntable) {
    int i;
    double x, x1;
    for (i = 1; i <= N; i++) {
        x = cos(CH_C_PI * (i - .25) / (N + .5));
        int iters = 0;
        do {
            ++iters;
            x1 = x;
            x -= glege_eval(N, x, lcoef) / glege_diff(N, x, lcoef);
        } while (fabs(x - x1) > 1e-12 && iters < 25);

        Lroots[ntable][i - 1] = x;

        x1 = glege_diff(N, x, lcoef);
        Weight[ntable][i - 1] = 2 / ((1 - x * x) * x1 * x1);
    }
}